

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

natwm_error color_value_from_config(map *map,char *key,color_value **result)

{
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar1;
  color_value *local_40;
  color_value *value;
  char *pcStack_30;
  natwm_error err;
  char *string;
  color_value **result_local;
  char *key_local;
  map *map_local;
  
  uVar1 = 0x104ad9;
  pcStack_30 = (char *)0x0;
  string = (char *)result;
  result_local = (color_value **)key;
  key_local = (char *)map;
  value._4_4_ = config_find_string(map,key,&stack0xffffffffffffffd0);
  if (value._4_4_ == NO_ERROR) {
    local_40 = (color_value *)0x0;
    value._4_4_ = color_value_from_string(pcStack_30,&local_40);
    if (value._4_4_ == NO_ERROR) {
      *(color_value **)string = local_40;
      map_local._4_4_ = NO_ERROR;
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to retrieve color value from \'%s\'",
                      result_local,in_R8,in_R9,uVar1);
      map_local._4_4_ = value._4_4_;
    }
  }
  else {
    if (value._4_4_ == NOT_FOUND_ERROR) {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find config item for \'%s\'",result_local,
                      in_R8,in_R9,uVar1);
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,
                      "Failed to find valid color value for config item \'%s\'",result_local,in_R8,
                      in_R9,uVar1);
    }
    map_local._4_4_ = value._4_4_;
  }
  return map_local._4_4_;
}

Assistant:

enum natwm_error color_value_from_config(const struct map *map, const char *key,
                                         struct color_value **result)
{
        const char *string = NULL;
        enum natwm_error err = config_find_string(map, key, &string);

        if (err != NO_ERROR) {
                if (err == NOT_FOUND_ERROR) {
                        LOG_ERROR(natwm_logger, "Failed to find config item for '%s'", key);
                } else {
                        LOG_ERROR(natwm_logger,
                                  "Failed to find valid color value for config "
                                  "item '%s'",
                                  key);
                }

                return err;
        }

        struct color_value *value = NULL;

        err = color_value_from_string(string, &value);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to retrieve color value from '%s'", key);

                return err;
        }

        *result = value;

        return NO_ERROR;
}